

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier.cpp
# Opt level: O0

void __thiscall
license::hw_identifier::HwIdentifier::set_identification_strategy
          (HwIdentifier *this,LCC_API_HW_IDENTIFICATION_STRATEGY strategy)

{
  byte bVar1;
  logic_error *this_00;
  byte *pbVar2;
  uint8_t stratMov;
  LCC_API_HW_IDENTIFICATION_STRATEGY strategy_local;
  HwIdentifier *this_local;
  
  if ((strategy != STRATEGY_NONE) && (strategy != STRATEGY_DEFAULT)) {
    pbVar2 = std::array<unsigned_char,_8UL>::operator[](&this->m_data,1);
    bVar1 = *pbVar2;
    pbVar2 = std::array<unsigned_char,_8UL>::operator[](&this->m_data,1);
    *pbVar2 = bVar1 & 0x1f | (byte)(strategy << 5);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Only known strategies are permitted");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void HwIdentifier::set_identification_strategy(LCC_API_HW_IDENTIFICATION_STRATEGY strategy) {
	if (strategy == STRATEGY_NONE || strategy == STRATEGY_DEFAULT) {
		throw logic_error("Only known strategies are permitted");
	}
	uint8_t stratMov = (strategy << 5);
	m_data[1] = (m_data[1] & 0x1F) | stratMov;
}